

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O0

Param * __thiscall kratos::Generator::parameter(Generator *this,string *parameter_name)

{
  element_type *peVar1;
  Generator *local_30;
  undefined1 local_28 [8];
  shared_ptr<kratos::Param> ptr;
  string *parameter_name_local;
  Generator *this_local;
  
  local_30 = this;
  ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)parameter_name;
  std::make_shared<kratos::Param,kratos::Generator*,std::__cxx11::string_const&>
            ((Generator **)local_28,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_30);
  std::
  map<std::__cxx11::string,std::shared_ptr<kratos::Param>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
  ::emplace<std::__cxx11::string_const&,std::shared_ptr<kratos::Param>&>
            ((map<std::__cxx11::string,std::shared_ptr<kratos::Param>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<kratos::Param>>>>
              *)&this->params_,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ptr.super___shared_ptr<kratos::Param,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi,
             (shared_ptr<kratos::Param> *)local_28);
  peVar1 = std::__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::Param,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                     )local_28);
  std::shared_ptr<kratos::Param>::~shared_ptr((shared_ptr<kratos::Param> *)local_28);
  return peVar1;
}

Assistant:

Param &Generator::parameter(const std::string &parameter_name) {
    auto ptr = std::make_shared<Param>(this, parameter_name);
    params_.emplace(parameter_name, ptr);
    return *ptr;
}